

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxBitOp::Resolve(FxBitOp *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxConstant *this_00;
  FxExpression *pFVar4;
  uint local_9c;
  uint local_98;
  uint local_94;
  FxExpression *e;
  uint local_48;
  int v2;
  ExpVal local_38;
  undefined4 local_24;
  PType *pPStack_20;
  int v1;
  FCompileContext *ctx_local;
  FxBitOp *this_local;
  
  this_local = this;
  if (((this->super_FxBinary).super_FxExpression.isresolved & 1U) == 0) {
    (this->super_FxBinary).super_FxExpression.isresolved = true;
    pPStack_20 = (PType *)ctx;
    ctx_local = (FCompileContext *)this;
    if ((this->super_FxBinary).left != (FxExpression *)0x0) {
      pFVar4 = (this->super_FxBinary).left;
      iVar2 = (*pFVar4->_vptr_FxExpression[2])(pFVar4,ctx);
      (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if ((this->super_FxBinary).right != (FxExpression *)0x0) {
      pFVar4 = (this->super_FxBinary).right;
      iVar2 = (*pFVar4->_vptr_FxExpression[2])(pFVar4,pPStack_20);
      (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
    }
    if (((this->super_FxBinary).left == (FxExpression *)0x0) ||
       ((this->super_FxBinary).right == (FxExpression *)0x0)) {
      if (this != (FxBitOp *)0x0) {
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
      }
      this_local = (FxBitOp *)0x0;
    }
    else {
      if ((((this->super_FxBinary).left)->ValueType == (PType *)TypeBool) &&
         (((this->super_FxBinary).right)->ValueType == (PType *)TypeBool)) {
        (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
      }
      else {
        bVar1 = FxExpression::IsNumeric((this->super_FxBinary).left);
        if ((!bVar1) || (bVar1 = FxExpression::IsNumeric((this->super_FxBinary).right), !bVar1)) {
          FScriptPosition::Message
                    (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                     "Incompatible operands for bit operation");
          if (this != (FxBitOp *)0x0) {
            (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
        bVar1 = FxBinary::Promote(&this->super_FxBinary,(FCompileContext *)pPStack_20,true);
        if (!bVar1) {
          return (FxExpression *)0x0;
        }
      }
      uVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      this_local = this;
      if (((uVar3 & 1) != 0) &&
         (uVar3 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])(), (uVar3 & 1) != 0)) {
        FxConstant::GetValue((FxConstant *)&local_38);
        uVar3 = ExpVal::GetInt(&local_38);
        ExpVal::~ExpVal(&local_38);
        pFVar4 = (this->super_FxBinary).right;
        local_24 = uVar3;
        FxConstant::GetValue((FxConstant *)&e);
        uVar3 = ExpVal::GetInt((ExpVal *)&e);
        ExpVal::~ExpVal((ExpVal *)&e);
        local_48 = uVar3;
        this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar4);
        if ((this->super_FxBinary).Operator == 0x26) {
          local_94 = local_24 & local_48;
        }
        else {
          if ((this->super_FxBinary).Operator == 0x7c) {
            local_98 = local_24 | local_48;
          }
          else {
            if ((this->super_FxBinary).Operator == 0x5e) {
              local_9c = local_24 ^ local_48;
            }
            else {
              local_9c = 0;
            }
            local_98 = local_9c;
          }
          local_94 = local_98;
        }
        FxConstant::FxConstant
                  (this_00,local_94,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
        this_local = (FxBitOp *)this_00;
        if (this != (FxBitOp *)0x0) {
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
        }
      }
    }
  }
  return (FxExpression *)this_local;
}

Assistant:

FxExpression *FxBitOp::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for bit operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == '&'? v1 & v2 : 
			Operator == '|'? v1 | v2 : 
			Operator == '^'? v1 ^ v2 : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}